

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O1

void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t **pvSyms)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  Kit_DsdObj_t KVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  Kit_DsdObj_t *pKVar11;
  ulong local_48;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  if ((iLit & 1U) != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x124,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
  }
  uVar10 = (uint)iLit >> 1;
  uVar2 = p->nVars;
  if ((uint)p->nNodes + (uint)uVar2 <= uVar10) {
LAB_004471e9:
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (uVar10 < uVar2) {
    pKVar11 = (Kit_DsdObj_t *)0x0;
  }
  else {
    pKVar11 = p->pNodes[(ulong)uVar10 - (ulong)uVar2];
  }
  if (pKVar11 != (Kit_DsdObj_t *)0x0) {
    KVar5 = *pKVar11;
    if (0x3ffffff < (uint)KVar5) {
      uVar8 = 0;
      do {
        Amap_CreateCheckAsym_rec
                  (p,*(ushort *)((long)&pKVar11[1].field_0x0 + uVar8 * 2) & 0xfffffffe,pvSyms);
        uVar8 = uVar8 + 1;
        KVar5 = *pKVar11;
      } while (uVar8 < (uint)KVar5 >> 0x1a);
    }
    uVar10 = (uint)KVar5 >> 6 & 7;
    if (uVar10 - 3 < 2) {
      if (0x3ffffff < (uint)*pKVar11) {
        local_48 = 1;
        uVar8 = 0;
        do {
          uVar1 = uVar8 + 1;
          uVar9 = local_48;
          if (uVar1 < (uint)*pKVar11 >> 0x1a) {
            do {
              uVar2 = *(ushort *)((long)&pKVar11[1].field_0x0 + uVar8 * 2);
              uVar3 = *(ushort *)((long)&pKVar11[1].field_0x0 + uVar9 * 2);
              if (((uVar3 ^ uVar2) & 1) != 0) {
                uVar2 = uVar2 >> 1;
                uVar4 = p->nVars;
                uVar10 = (uint)p->nNodes + (uint)uVar4;
                if (uVar10 <= uVar2) goto LAB_004471e9;
                if (((uint)uVar2 < (uint)uVar4) ||
                   (p->pNodes[(ulong)(uint)uVar2 - (ulong)uVar4] == (Kit_DsdObj_t *)0x0)) {
                  uVar3 = uVar3 >> 1;
                  if (uVar10 <= uVar3) goto LAB_004471e9;
                  uVar10 = (uint)uVar3;
                  if ((uVar10 < uVar4) ||
                     (p->pNodes[(ulong)uVar10 - (ulong)uVar4] == (Kit_DsdObj_t *)0x0)) {
                    if (*pvSyms == (Vec_Int_t *)0x0) {
                      pVVar6 = (Vec_Int_t *)malloc(0x10);
                      pVVar6->nCap = 0x10;
                      pVVar6->nSize = 0;
                      piVar7 = (int *)malloc(0x40);
                      pVVar6->pArray = piVar7;
                      *pvSyms = pVVar6;
                    }
                    Vec_IntPush(*pvSyms,(uint)uVar2 << 8 | uVar10);
                  }
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < (uint)*pKVar11 >> 0x1a);
          }
          local_48 = local_48 + 1;
          uVar8 = uVar1;
        } while (uVar1 < (uint)*pKVar11 >> 0x1a);
      }
    }
    else if (uVar10 != 5) {
      __assert_fail("pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                    ,300,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
    }
  }
  return;
}

Assistant:

void Amap_CreateCheckAsym_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t ** pvSyms )
{
    Kit_DsdObj_t * pObj; 
    int i, k, iFanin;
    assert( !Abc_LitIsCompl(iLit) );
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return;
    Kit_DsdObjForEachFanin( p, pObj, iFanin, i )
        Amap_CreateCheckAsym_rec( p, Abc_LitRegular(iFanin), pvSyms );
    if ( pObj->Type == KIT_DSD_PRIME )
        return;
    assert( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj->nFans; i++ )
    for ( k = i+1; k < (int)pObj->nFans; k++ )
    {
        if ( Abc_LitIsCompl(pObj->pFans[i]) != Abc_LitIsCompl(pObj->pFans[k]) && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[i])) == NULL && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[k])) == NULL )
        {
            if ( *pvSyms == NULL )
                *pvSyms = Vec_IntAlloc( 16 );
            Vec_IntPush( *pvSyms, (Abc_Lit2Var(pObj->pFans[i]) << 8) | Abc_Lit2Var(pObj->pFans[k]) );
        }
    }
}